

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yangdata.c
# Opt level: O0

LY_ERR yangdata_compile(lysc_ctx *cctx,lysp_ext_instance *extp,lysc_ext_instance *ext)

{
  uint32_t uVar1;
  lysc_node *parent;
  lysc_module *module;
  char *pcVar2;
  uint32_t *puVar3;
  long *plVar4;
  char *pcVar5;
  ly_ctx *ctx;
  bool bVar6;
  lysc_node *local_58;
  lysc_node *snode;
  lysc_module *mod_c;
  char *p__;
  uint32_t prev_options;
  ly_bool valid;
  lysc_node *child;
  LY_ERR ret;
  lysc_ext_instance *ext_local;
  lysp_ext_instance *extp_local;
  lysc_ctx *cctx_local;
  
  p__._7_1_ = true;
  puVar3 = lyplg_ext_compile_get_options(cctx);
  uVar1 = *puVar3;
  if (ext->substmts == (lysc_ext_substmt *)0x0) {
    plVar4 = (long *)calloc(1,0x38);
  }
  else {
    plVar4 = (long *)realloc(&ext->substmts[-1].storage_p,
                             ((long)ext->substmts[-1].storage_p + 3) * 0x10 + 8);
  }
  if (plVar4 == (long *)0x0) {
    lyplg_ext_compile_log
              (cctx,ext,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yangdata_compile");
    cctx_local._4_4_ = LY_EMEM;
  }
  else {
    ext->substmts = (lysc_ext_substmt *)(plVar4 + 1);
    if (ext->substmts != (lysc_ext_substmt *)0x0) {
      memset(ext->substmts + *plVar4,0,0x30);
    }
    ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
    ext->substmts->stmt = LY_STMT_CONTAINER;
    ext->substmts->storage_p = &ext->compiled;
    ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
    ext->substmts[1].stmt = LY_STMT_CHOICE;
    ext->substmts[1].storage_p = &ext->compiled;
    ext->substmts[-1].storage_p = (void **)((long)ext->substmts[-1].storage_p + 1);
    ext->substmts[2].stmt = LY_STMT_USES;
    ext->substmts[2].storage_p = &ext->compiled;
    puVar3 = lyplg_ext_compile_get_options(cctx);
    *puVar3 = *puVar3 | 0xc;
    cctx_local._4_4_ = lyplg_ext_compile_extension_instance(cctx,extp,ext);
    puVar3 = lyplg_ext_compile_get_options(cctx);
    *puVar3 = uVar1;
    if (cctx_local._4_4_ == LY_SUCCESS) {
      parent = (lysc_node *)ext->compiled;
      if (parent == (lysc_node *)0x0) {
        p__._7_1_ = false;
        lyplg_ext_compile_log
                  (cctx,ext,LY_LLERR,LY_EVALID,
                   "Extension %s is instantiated without any top level data node, but exactly one container data node is expected."
                   ,extp->name);
      }
      else if (parent->next == (lysc_node *)0x0) {
        if (parent->nodetype == 2) {
          module = (lysc_module *)ext->parent;
          local_58 = (lysc_node *)0x0;
          do {
            local_58 = lys_getnext(local_58,parent,module,0);
            if (local_58 == (lysc_node *)0x0) goto LAB_002080d2;
            if (local_58->next != (lysc_node *)0x0) {
              p__._7_1_ = false;
              lyplg_ext_compile_log
                        (cctx,ext,LY_LLERR,LY_EVALID,
                         "Extension %s is instantiated with multiple top level data nodes (inside a single choice\'s case), but only a single container data node is allowed."
                         ,extp->name);
              goto LAB_002080d2;
            }
          } while (local_58->nodetype == 1);
          p__._7_1_ = false;
          pcVar2 = extp->name;
          pcVar5 = lys_nodetype2str(local_58->nodetype);
          lyplg_ext_compile_log
                    (cctx,ext,LY_LLERR,LY_EVALID,
                     "Extension %s is instantiated with %s top level data node (inside a choice), but only a single container data node is allowed."
                     ,pcVar2,pcVar5);
        }
        else {
          bVar6 = parent->nodetype != 1;
          if (bVar6) {
            pcVar2 = extp->name;
            pcVar5 = lys_nodetype2str(parent->nodetype);
            lyplg_ext_compile_log
                      (cctx,ext,LY_LLERR,LY_EVALID,
                       "Extension %s is instantiated with %s top level data node, but only a single container data node is allowed."
                       ,pcVar2,pcVar5);
          }
          p__._7_1_ = !bVar6;
        }
      }
      else {
        p__._7_1_ = false;
        lyplg_ext_compile_log
                  (cctx,ext,LY_LLERR,LY_EVALID,
                   "Extension %s is instantiated with multiple top level data nodes, but only a single container data node is allowed."
                   ,extp->name);
      }
LAB_002080d2:
      if (p__._7_1_) {
        cctx_local._4_4_ = LY_SUCCESS;
      }
      else {
        ctx = lyplg_ext_compile_get_ctx(cctx);
        yangdata_cfree(ctx,ext);
        ext->substmts = (lysc_ext_substmt *)0x0;
        ext->compiled = (void *)0x0;
        cctx_local._4_4_ = LY_EVALID;
      }
    }
  }
  return cctx_local._4_4_;
}

Assistant:

static LY_ERR
yangdata_compile(struct lysc_ctx *cctx, const struct lysp_ext_instance *extp, struct lysc_ext_instance *ext)
{
    LY_ERR ret;
    const struct lysc_node *child;
    ly_bool valid = 1;
    uint32_t prev_options = *lyplg_ext_compile_get_options(cctx);

    /* compile yangg-data substatements */
    LY_ARRAY_CREATE_GOTO(cctx->ctx, ext->substmts, 3, ret, emem);
    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[0].stmt = LY_STMT_CONTAINER;
    ext->substmts[0].storage_p = (void **)&ext->compiled;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[1].stmt = LY_STMT_CHOICE;
    ext->substmts[1].storage_p = (void **)&ext->compiled;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[2].stmt = LY_STMT_USES;
    ext->substmts[2].storage_p = (void **)&ext->compiled;

    *lyplg_ext_compile_get_options(cctx) |= LYS_COMPILE_NO_CONFIG | LYS_COMPILE_NO_DISABLED;
    ret = lyplg_ext_compile_extension_instance(cctx, extp, ext);
    *lyplg_ext_compile_get_options(cctx) = prev_options;
    if (ret) {
        return ret;
    }

    /* check that we have really just a single container data definition in the top */
    child = ext->compiled;
    if (!child) {
        valid = 0;
        lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,
                "Extension %s is instantiated without any top level data node, but exactly one container data node is expected.",
                extp->name);
    } else if (child->next) {
        valid = 0;
        lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,
                "Extension %s is instantiated with multiple top level data nodes, but only a single container data node is allowed.",
                extp->name);
    } else if (child->nodetype == LYS_CHOICE) {
        /* all the choice's case are expected to result to a single container node */
        struct lysc_module *mod_c = ext->parent;
        const struct lysc_node *snode = NULL;

        while ((snode = lys_getnext(snode, child, mod_c, 0))) {
            if (snode->next) {
                valid = 0;
                lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,
                        "Extension %s is instantiated with multiple top level data nodes (inside a single choice's case), "
                        "but only a single container data node is allowed.", extp->name);
                break;
            } else if (snode->nodetype != LYS_CONTAINER) {
                valid = 0;
                lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,
                        "Extension %s is instantiated with %s top level data node (inside a choice), "
                        "but only a single container data node is allowed.", extp->name, lys_nodetype2str(snode->nodetype));
                break;
            }
        }
    } else if (child->nodetype != LYS_CONTAINER) {
        /* via uses */
        valid = 0;
        lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,
                "Extension %s is instantiated with %s top level data node, but only a single container data node is allowed.",
                extp->name, lys_nodetype2str(child->nodetype));
    }

    if (!valid) {
        yangdata_cfree(lyplg_ext_compile_get_ctx(cctx), ext);
        ext->compiled = ext->substmts = NULL;
        return LY_EVALID;
    }

    return LY_SUCCESS;

emem:
    lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EMEM, "Memory allocation failed (%s()).", __func__);
    return LY_EMEM;
}